

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void CConsole::ConModCommandStatus(IResult *pResult,void *pUser)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  char aBuf [240];
  char acStack_128 [240];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  mem_zero(acStack_128,0xf0);
  pvVar2 = pUser;
  iVar4 = 0;
  while (pvVar2 = *(void **)((long)pvVar2 + 0x28), pvVar2 != (void *)0x0) {
    if (((*(uint *)((long)pvVar2 + 0x30) & *(uint *)((long)pUser + 0x10)) != 0) &&
       (*(int *)((long)pvVar2 + 8) == 1)) {
      iVar1 = str_length(*(char **)((long)pvVar2 + 0x10));
      iVar3 = iVar1 + iVar4;
      if (iVar3 < 0xee) {
        if (0 < iVar4) {
          str_append(acStack_128,", ",0xf0);
          iVar3 = iVar1 + iVar4 + 2;
        }
        str_append(acStack_128,*(char **)((long)pvVar2 + 0x10),0xf0);
        iVar4 = iVar3;
      }
      else {
        (**(code **)(*pUser + 200))(pUser,0,"console",acStack_128);
        mem_zero(acStack_128,0xf0);
        str_copy(acStack_128,*(char **)((long)pvVar2 + 0x10),0xf0);
        iVar4 = iVar1;
      }
    }
  }
  if (0 < iVar4) {
    (**(code **)(*pUser + 200))(pUser,0,"console",acStack_128,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::ConModCommandStatus(IResult *pResult, void *pUser)
{
	CConsole* pConsole = static_cast<CConsole *>(pUser);
	char aBuf[240];
	mem_zero(aBuf, sizeof(aBuf));
	int Used = 0;

	for(CCommand *pCommand = pConsole->m_pFirstCommand; pCommand; pCommand = pCommand->m_pNext)
	{
		if(pCommand->m_Flags&pConsole->m_FlagMask && pCommand->GetAccessLevel() == ACCESS_LEVEL_MOD)
		{
			int Length = str_length(pCommand->m_pName);
			if(Used + Length + 2 < (int)(sizeof(aBuf)))
			{
				if(Used > 0)
				{
					Used += 2;
					str_append(aBuf, ", ", sizeof(aBuf));
				}
				str_append(aBuf, pCommand->m_pName, sizeof(aBuf));
				Used += Length;
			}
			else
			{
				pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
				mem_zero(aBuf, sizeof(aBuf));
				str_copy(aBuf, pCommand->m_pName, sizeof(aBuf));
				Used = Length;
			}
		}
	}
	if(Used > 0)
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}